

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate1<double>::equals(PointerGate1<double> *this,QObject<double> *other)

{
  QGate1<double> *pQVar1;
  QGate1<double> *other_00;
  PointerGate1<double> *local_40;
  G *p;
  QObject<double> *other_local;
  PointerGate1<double> *this_local;
  
  if (other == (QObject<double> *)0x0) {
    local_40 = (PointerGate1<double> *)0x0;
  }
  else {
    local_40 = (PointerGate1<double> *)__dynamic_cast(other,&QObject<double>::typeinfo,&typeinfo,0);
  }
  if (local_40 == (PointerGate1<double> *)0x0) {
    pQVar1 = ptr(this);
    this_local._7_1_ = QObject<double>::operator==(other,&pQVar1->super_QObject<double>);
  }
  else {
    pQVar1 = ptr(local_40);
    other_00 = ptr(this);
    this_local._7_1_ =
         QObject<double>::operator==
                   (&pQVar1->super_QObject<double>,&other_00->super_QObject<double>);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate1< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }